

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

void sigfiddle_vibrato(t_sigfiddle *x,t_floatarg vibtime,t_floatarg vibdepth)

{
  t_float local_18;
  float local_14;
  t_floatarg vibdepth_local;
  t_floatarg vibtime_local;
  t_sigfiddle *x_local;
  
  local_14 = vibtime;
  if (vibtime < 0.0) {
    local_14 = 0.0;
  }
  local_18 = vibdepth;
  if (vibdepth <= 0.0) {
    local_18 = 1000.0;
  }
  x->x_vibtime = (int)local_14;
  x->x_vibdepth = local_18;
  x->x_vibbins = (int)((x->x_sr * 0.001 * local_14) / (float)x->x_hop);
  if (0x13 < x->x_vibbins) {
    x->x_vibbins = 0x13;
  }
  if (x->x_vibbins < 1) {
    x->x_vibbins = 1;
  }
  return;
}

Assistant:

void sigfiddle_vibrato(t_sigfiddle *x, t_floatarg vibtime, t_floatarg vibdepth)
{
    if (vibtime < 0) vibtime = 0;
    if (vibdepth <= 0) vibdepth = 1000;
    x->x_vibtime = vibtime;
    x->x_vibdepth = vibdepth;
    x->x_vibbins = (x->x_sr * 0.001  * vibtime) / x->x_hop;
    if (x->x_vibbins >= HISTORY) x->x_vibbins = HISTORY - 1;
    if (x->x_vibbins < 1) x->x_vibbins = 1;
}